

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  std::__cxx11::string::append
            ((string *)
             &(this->m_messages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_start[index].message);
  (*this->m_resultCapture->_vptr_IResultCapture[6])
            (this->m_resultCapture,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start + index);
  this->m_captured = this->m_captured + 1;
  return;
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }